

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<1,_458>::PolynomialComponents::PolynomialComponents
          (PolynomialComponents *this,ListRecord *list)

{
  uchar *in_RCX;
  size_t siglen;
  size_t in_R8;
  
  ListRecord::ListRecord(&this->super_ListRecord,list);
  verify((EVP_PKEY_CTX *)
         ((ulong)((long)(this->super_ListRecord).data.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_ListRecord).data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3),
         (uchar *)(ulong)(uint)((_Head_base<3UL,_long,_false> *)
                               ((long)&(this->super_ListRecord).metadata.fields.
                                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
                                       .super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                                       super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->
                               _M_head_impl,siglen,in_RCX,in_R8);
  return;
}

Assistant:

PolynomialComponents( ListRecord&& list ) :
  ListRecord( std::move( list ) ) {

    verify( ListRecord::NPL(), this->NPLY() );
  }